

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O2

Action __thiscall
psy::C::SyntaxDumper::visitVariableAndOrFunctionDeclaration
          (SyntaxDumper *this,VariableAndOrFunctionDeclarationSyntax *node)

{
  long lVar1;
  VariableAndOrFunctionDeclarationSyntax *pVVar2;
  SyntaxToken aSStack_58 [56];
  
  traverseDeclaration(this,(DeclarationSyntax *)node);
  pVVar2 = node + 0x28;
  while (lVar1 = *(long *)pVVar2, lVar1 != 0) {
    (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(lVar1 + 8));
    pVVar2 = (VariableAndOrFunctionDeclarationSyntax *)(lVar1 + 0x10);
  }
  pVVar2 = node + 0x30;
  while (lVar1 = *(long *)pVVar2, lVar1 != 0) {
    (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(lVar1 + 8));
    psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax*>::delimiterToken();
    (**(code **)(*(long *)this + 0x2e8))(this,aSStack_58,node);
    psy::C::SyntaxToken::~SyntaxToken(aSStack_58);
    pVVar2 = (VariableAndOrFunctionDeclarationSyntax *)(lVar1 + 0x10);
  }
  VariableAndOrFunctionDeclarationSyntax::semicolonToken
            ((VariableAndOrFunctionDeclarationSyntax *)aSStack_58);
  (**(code **)(*(long *)this + 0x2e8))(this,aSStack_58,node);
  psy::C::SyntaxToken::~SyntaxToken(aSStack_58);
  return Skip;
}

Assistant:

virtual Action visitVariableAndOrFunctionDeclaration(const VariableAndOrFunctionDeclarationSyntax* node) override
    {
        traverseDeclaration(node);
        for (auto iter = node->specifiers(); iter; iter = iter->next)
            nonterminal(iter->value);
        for (auto iter = node->declarators(); iter; iter = iter->next) {
            nonterminal(iter->value);
            terminal(iter->delimiterToken(), node);
        }
        terminal(node->semicolonToken(), node);
        return Action::Skip;
    }